

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.h
# Opt level: O2

void __thiscall ArgumentHandlers::Arguments::Arguments(Arguments *this)

{
  allocator<char> local_41;
  string local_40 [32];
  
  (this->maxplus_updateT)._M_dataplus._M_p = (pointer)&(this->maxplus_updateT).field_2;
  (this->maxplus_updateT)._M_string_length = 0;
  (this->maxplus_updateT).field_2._M_local_buf[0] = '\0';
  this->verbose = 0;
  this->testMode = false;
  this->dpf = (char *)0x0;
  this->problem_type = PARSE;
  this->nrAgents = 2;
  this->nrHouses = 3;
  this->nrFLs = 3;
  this->islandConf = InLine;
  this->alohaVariation = NoNewPacket;
  this->maxBacklog = 2;
  this->dryrun = 0;
  this->sparse = 0;
  this->isTOI = 0;
  this->description = (char *)0x0;
  this->prefix = (char *)0x0;
  *(undefined8 *)((long)&this->prefix + 6) = 0;
  this->discount = -1.0;
  this->horizon = 2;
  this->infiniteHorizon = false;
  this->nrRestarts = 1;
  this->jpolIndex = 0;
  this->bgsolver = BFS;
  this->deadline = 0.0;
  this->gmaa = MAAstar;
  this->nrAMRestarts = 10;
  this->k = 1;
  *(undefined8 *)((long)&this->saveTimings + 1) = 0;
  this->saveAllBGs = 0;
  this->saveTimings = 0;
  this->exactBGs = true;
  this->slack = 0.0;
  this->GMAAdeadline = 0;
  this->useBGclustering = 0;
  this->BGClusterAlgorithm = 0;
  this->thresholdJB = 0.0;
  this->thresholdPjaoh = 0.0;
  this->jesp = JESPDP;
  this->savePOMDP = 0;
  this->saveIntermediateV = 0;
  this->minimumNrIterations = 0;
  this->initializeWithImmediateReward = 0;
  this->initializeWithZero = 0;
  this->uniqueBeliefs = 0;
  this->nrBeliefs = 10;
  this->saveBeliefs = 0;
  this->resetAfter = 0;
  this->useQMDPforSamplingBeliefs = 0;
  this->QMDPexploreProb = 0.1;
  this->backup = POMDP;
  this->bgBackup = BGIP_SOLVER_EXHAUSTIVE;
  this->waitPenalty = -1.0;
  this->weight = -1.0;
  this->commModel = -1;
  this->computeVectorForEachBelief = 0;
  this->qheur = eQheurUndefined;
  this->QHybridHorizonLastTimeSteps = 0;
  this->QHybridFirstTS = eQBG;
  this->QHybridLastTS = eQMDP;
  this->TreeIPpruneAfterUnion = true;
  this->TreeIPpruneAfterCrossSum = true;
  this->TreeIPuseVectorCache = true;
  this->acceleratedPruningThreshold = 200;
  this->nrRuns = 1000;
  this->randomSeed = 0x2a;
  this->successfulCommProb = -1.0;
  this->TOIpolicy = 0;
  this->TOIcentralized = 0;
  this->useCentralizedModels = 0;
  this->nrCERestarts = 10;
  this->nrCEIterations = 0x32;
  this->nrCESamples = 0x32;
  this->nrCESamplesForUpdate = 10;
  this->CE_use_hard_threshold = true;
  this->CE_alpha = 0.3;
  this->nrCEEvaluationRuns = 100;
  this->nrNodesExpanded = 10;
  this->nrRLruns = 10000;
  this->nrIntermediateEvaluations = 10;
  this->startAtRLrun = 0;
  this->maxplus_maxiter = 0x19;
  this->maxplus_verbose = 0;
  this->maxplus_damping = 0.5;
  this->maxplus_nrRestarts = 1;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"PARALL",&local_41);
  std::__cxx11::string::operator=((string *)&this->maxplus_updateT,local_40);
  std::__cxx11::string::~string(local_40);
  this->BnBJointTypeOrdering = IdentityMapping;
  this->BnB_keepAll = false;
  this->BnB_consistentCompleteInformationHeur = true;
  this->bgFilename = (char *)0x0;
  this->startIndex = -1;
  this->endIndex = -1;
  this->useASCIIformat = false;
  this->isCGBG = false;
  this->marginalize = false;
  this->marginalizationIndex = 0;
  this->falseNegativeObs = -1;
  this->mmdp_method = ValueIteration;
  return;
}

Assistant:

Arguments()
    {
        // general
        verbose = 0;
        testMode = false;

        // problem file
        dpf = 0;
        problem_type = PARSE;
        nrAgents = 2;
        nrHouses = 3;
        nrFLs = 3;
        islandConf = ProblemAloha::InLine;
        alohaVariation = ProblemAloha::NoNewPacket;
        maxBacklog = 2;

        // output
        dryrun = 0;
        description = NULL;
        prefix = NULL;
        noReCompute = 0;
        outputPolicy = false;

        // model
        cache_flat_models = false;
        sparse = 0;
        isTOI = 0;
        discount = -1;

        // solution method
        horizon = 2;
        infiniteHorizon = false;
        nrRestarts = 1;

        // jpol index
        jpolIndex = 0;

        // BGSolver options
        bgsolver = BFS;
        deadline = 0;

        // GMAA
        gmaa = MAAstar;
        nrAMRestarts = 10;
        k = 1;
        saveAllBGs = 0;
        saveTimings = 0; // also used for Perseus
        useQcache = 0;
        requireQcache = false;
        exactBGs = true;
        slack = 0.0;
        GMAAdeadline = 0;

        // GMAA Cluster
        useBGclustering = 0;
        BGClusterAlgorithm = 0;
        thresholdJB = 0;
        thresholdPjaoh = 0;

        //JESP options
        jesp = JESPDP;

        // Perseus
        savePOMDP = 0;
        saveIntermediateV = 0;
        minimumNrIterations = 0;
        initializeWithImmediateReward = 0;
        initializeWithZero = 0;

        // Perseus belief set sampling options
        nrBeliefs = 10;
        saveBeliefs = 0;
        resetAfter = 0;
        uniqueBeliefs = 0;
        useQMDPforSamplingBeliefs = 0;
        QMDPexploreProb = 0.1;

        // PerseusBackup
        backup = POMDP;
        bgBackup = BGIP_SOLVER_EXHAUSTIVE;
        waitPenalty = -1;
        weight = -1;
        commModel = -1;
        computeVectorForEachBelief = 0;

        // Qheur options
        qheur = eQheurUndefined;
        QHybridHorizonLastTimeSteps = 0;
        QHybridFirstTS = eQBG;
        QHybridLastTS = eQMDP;
        TreeIPpruneAfterUnion = true;
        TreeIPpruneAfterCrossSum = true;
        TreeIPuseVectorCache = true;
        acceleratedPruningThreshold = 200;

        // Simulation options
        nrRuns = 1000;
        randomSeed = 42;
        successfulCommProb = -1;

        // TOI options
        TOIpolicy = 0;

        // TOIcentralized options
        TOIcentralized = 0;
        useCentralizedModels = 0;

        // CE (cross-entropy) options 
        nrCERestarts = 10;
        nrCEIterations = 50;
        nrCESamples = 50;
        nrCESamplesForUpdate = 10;
        CE_use_hard_threshold = 1; //(gamma in CE papers)
        CE_alpha = 0.3; //the learning rate
        nrCEEvaluationRuns = 100; // number of policy evaluation runs. 0 = exact evaluation

        // online POMDP 
        nrNodesExpanded = 10;

        // RL options;
        nrRLruns=10000;
        nrIntermediateEvaluations=10;
        startAtRLrun=0;
        // options for max-plus
        maxplus_maxiter = 25;
        maxplus_verbose = 0;
        maxplus_damping = 0.5;
        maxplus_nrRestarts = 1;
        maxplus_updateT = std::string("PARALL");

        BnBJointTypeOrdering = IdentityMapping;
        BnB_keepAll = false;
        BnB_consistentCompleteInformationHeur = true;

        // solveBG options
        bgFilename = 0;
        startIndex = -1;
        endIndex = -1;
        useASCIIformat = false;
        isCGBG = false;

        // Event-Driven POMDP options
        marginalize = false;
        marginalizationIndex = false;
        falseNegativeObs = -1;

        mmdp_method = ValueIteration;
    }